

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<char16_t>::dispose(ArrayBuilder<char16_t> *this)

{
  char16_t *firstElement;
  RemoveConst<char16_t> *pRVar1;
  char16_t *pcVar2;
  char16_t *endCopy;
  char16_t *posCopy;
  char16_t *ptrCopy;
  ArrayBuilder<char16_t> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pcVar2 = this->endPtr;
  if (firstElement != (char16_t *)0x0) {
    this->ptr = (char16_t *)0x0;
    this->pos = (RemoveConst<char16_t> *)0x0;
    this->endPtr = (char16_t *)0x0;
    ArrayDisposer::dispose<char16_t>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 1,
               (long)pcVar2 - (long)firstElement >> 1);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }